

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

int __thiscall ncnn::ParamDict::load_param_bin(ParamDict *this,DataReader *dr)

{
  int *piVar1;
  Allocator *pAVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  void *pvVar6;
  char *__format;
  size_t sVar7;
  Mat *pMVar8;
  int id;
  int len;
  int local_48;
  int local_44 [3];
  void *local_38;
  
  clear(this);
  local_48 = 0;
  uVar3 = (*dr->_vptr_DataReader[3])(dr,&local_48,4);
  if (uVar3 == 4) {
    local_44[1] = 0;
    local_44[2] = 0;
    do {
      if ((long)local_48 == -0xe9) goto LAB_00123197;
      if (local_48 < -0x5b03) {
        local_48 = -0x5b04 - local_48;
        local_44[0] = 0;
        uVar3 = (*dr->_vptr_DataReader[3])(dr,local_44,4);
        iVar4 = local_44[0];
        if (uVar3 != 4) {
          __format = "ParamDict read array length failed %d\n";
          goto LAB_00123184;
        }
        lVar5 = (long)local_48;
        if ((((this->params[lVar5].v.dims != 1) || (this->params[lVar5].v.w != local_44[0])) ||
            (this->params[lVar5].v.elemsize != 4)) ||
           ((this->params[lVar5].v.elempack != 1 ||
            (this->params[lVar5].v.allocator != (Allocator *)0x0)))) {
          pMVar8 = &this->params[lVar5].v;
          piVar1 = this->params[lVar5].v.refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              pAVar2 = this->params[lVar5].v.allocator;
              if (pAVar2 == (Allocator *)0x0) {
                if (pMVar8->data != (void *)0x0) {
                  free(pMVar8->data);
                }
              }
              else {
                (*pAVar2->_vptr_Allocator[3])();
              }
            }
          }
          sVar7 = (size_t)iVar4;
          pMVar8->data = (void *)0x0;
          this->params[lVar5].v.refcount = (int *)0x0;
          this->params[lVar5].v.elemsize = 4;
          this->params[lVar5].v.elempack = 1;
          this->params[lVar5].v.allocator = (Allocator *)0x0;
          this->params[lVar5].v.dims = 1;
          this->params[lVar5].v.w = iVar4;
          this->params[lVar5].v.h = 1;
          this->params[lVar5].v.c = 1;
          this->params[lVar5].v.cstep = sVar7;
          if (iVar4 != 0) {
            local_38 = (void *)0x0;
            iVar4 = posix_memalign(&local_38,0x10,sVar7 * 4 + 4);
            pvVar6 = (void *)0x0;
            if (iVar4 == 0) {
              pvVar6 = local_38;
            }
            pMVar8->data = pvVar6;
            piVar1 = (int *)((long)pvVar6 + sVar7 * 4);
            this->params[lVar5].v.refcount = piVar1;
            *piVar1 = 1;
          }
        }
        uVar3 = (*dr->_vptr_DataReader[3])
                          (dr,this->params[local_48].v.data,(ulong)(uint)(local_44[0] << 2));
        if (uVar3 != local_44[0] << 2) {
          __format = "ParamDict read array element failed %d\n";
          goto LAB_00123184;
        }
        this->params[local_48].type = 4;
      }
      else {
        uVar3 = (*dr->_vptr_DataReader[3])(dr,&this->params[local_48].field_1,4);
        if (uVar3 != 4) {
          __format = "ParamDict read value failed %d\n";
          goto LAB_00123184;
        }
        this->params[local_48].type = 1;
      }
      uVar3 = (*dr->_vptr_DataReader[3])(dr,&local_48,4);
    } while (uVar3 == 4);
    __format = "ParamDict read EOP failed %d\n";
  }
  else {
    __format = "ParamDict read id failed %d\n";
  }
LAB_00123184:
  fprintf(_stderr,__format,(ulong)uVar3);
  local_44[1] = -1;
  local_44[2] = 0;
LAB_00123197:
  return (int)local_44._4_8_;
}

Assistant:

int ParamDict::load_param_bin(const DataReader& dr)
{
    clear();

//     binary 0
//     binary 100
//     binary 1
//     binary 1.250000
//     binary 3 | array_bit
//     binary 5
//     binary 0.1
//     binary 0.2
//     binary 0.4
//     binary 0.8
//     binary 1.0
//     binary -233(EOP)

    int id = 0;
    int nread;
    nread = dr.read(&id, sizeof(int));
    if (nread != (int)sizeof(int))
    {
        fprintf(stderr, "ParamDict read id failed %d\n", nread);
        return -1;
    }

    while (id != -233)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = 0;
            nread = dr.read(&len, sizeof(int));
            if (nread != (int)sizeof(int))
            {
                fprintf(stderr, "ParamDict read array length failed %d\n", nread);
                return -1;
            }

            params[id].v.create(len);

            float* ptr = params[id].v;
            nread = dr.read(ptr, sizeof(float) * len);
            if (nread != (int)sizeof(float) * len)
            {
                fprintf(stderr, "ParamDict read array element failed %d\n", nread);
                return -1;
            }

            params[id].type = 4;
        }
        else
        {
            nread = dr.read(&params[id].f, sizeof(float));
            if (nread != (int)sizeof(float))
            {
                fprintf(stderr, "ParamDict read value failed %d\n", nread);
                return -1;
            }

            params[id].type = 1;
        }

        nread = dr.read(&id, sizeof(int));
        if (nread != (int)sizeof(int))
        {
            fprintf(stderr, "ParamDict read EOP failed %d\n", nread);
            return -1;
        }
    }

    return 0;
}